

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFMatrixRef.h
# Opt level: O2

void __thiscall
TPZFMatrixRef<long_double>::TPZFMatrixRef
          (TPZFMatrixRef<long_double> *this,int64_t rows,longdouble **buf)

{
  TPZFMatrix<long_double>::TPZFMatrix
            (&this->super_TPZFMatrix<long_double>,&PTR_PTR_01678d00,rows,1,*buf,rows);
  (this->super_TPZFMatrix<long_double>).super_TPZMatrix<long_double>.super_TPZBaseMatrix.
  super_TPZSavable._vptr_TPZSavable = (_func_int **)&PTR__TPZFMatrixRef_01678a48;
  this->fOrigRef = buf;
  return;
}

Assistant:

TPZFMatrixRef(const int64_t rows, TVar * &buf) :
    TPZFMatrix<TVar>(rows,1,buf,rows), fOrigRef(buf) {}